

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

NodeAndBucket __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
FindHelper(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,ViewType k,TreeIterator *it)

{
  map_index_t b;
  int iVar1;
  NodeBase *pNVar2;
  char *__s2;
  char *pcVar3;
  NodeBase *__n;
  NodeAndBucket NVar4;
  VariantKey key;
  
  __s2 = k._M_str;
  __n = (NodeBase *)k._M_len;
  b = BucketNumber(this,k);
  pNVar2 = (NodeBase *)(this->super_UntypedMapBase).table_[b];
  if (((ulong)pNVar2 & 1) == 0 && pNVar2 != (NodeBase *)0x0) {
    do {
      if ((pNVar2[2].next == __n) &&
         ((__n == (NodeBase *)0x0 || (iVar1 = bcmp(pNVar2[1].next,__s2,(size_t)__n), iVar1 == 0))))
      goto LAB_001c285e;
      pNVar2 = pNVar2->next;
    } while (pNVar2 != (NodeBase *)0x0);
  }
  else if (((ulong)pNVar2 & 1) != 0) {
    pcVar3 = "";
    if (__s2 != (char *)0x0) {
      pcVar3 = __s2;
    }
    key.integral = (uint64_t)__n;
    key.data = pcVar3;
    NVar4 = UntypedMapBase::FindFromTree(&this->super_UntypedMapBase,b,key,it);
    pNVar2 = NVar4.node;
    b = NVar4.bucket;
    goto LAB_001c285e;
  }
  pNVar2 = (NodeBase *)0x0;
LAB_001c285e:
  NVar4.bucket = b;
  NVar4.node = pNVar2;
  NVar4._12_4_ = 0;
  return NVar4;
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k,
                           TreeIterator* it = nullptr) const {
    map_index_t b = BucketNumber(k);
    if (TableEntryIsNonEmptyList(b)) {
      auto* node = internal::TableEntryToNode(table_[b]);
      do {
        if (TS::Equals(static_cast<KeyNode*>(node)->key(), k)) {
          return {node, b};
        } else {
          node = node->next;
        }
      } while (node != nullptr);
    } else if (TableEntryIsTree(b)) {
      return FindFromTree(b, internal::RealKeyToVariantKey<Key>{}(k), it);
    }
    return {nullptr, b};
  }